

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O2

bool __thiscall ui::Led::OnEvent(Led *this,Event *event)

{
  int iVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 local_260 [64];
  ostream local_220 [512];
  
  iVar1 = this->trigger_selected_;
  ftxui::Event::Event((Event *)local_260,event);
  bVar2 = ftxui::ComponentBase::OnEvent(&this->super_ComponentBase,(Event *)local_260);
  std::__cxx11::string::~string((string *)(local_260 + 0x18));
  if (iVar1 != this->trigger_selected_) {
    std::operator+(&local_280,&this->file_path_,"/trigger");
    std::ofstream::ofstream(local_220,(string *)&local_280,_S_out);
    std::operator<<(local_220,
                    (string *)
                    ((this->trigger_entries_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + this->trigger_selected_));
    std::ofstream::~ofstream(local_220);
    std::__cxx11::string::~string((string *)&local_280);
    FetchState(this);
  }
  return bVar2;
}

Assistant:

bool OnEvent(Event event) override {
    int trigger_selected = trigger_selected_;
    bool ret = ComponentBase::OnEvent(event);
    if (trigger_selected != trigger_selected_) {
      std::ofstream(file_path_ + "/trigger")
          << trigger_entries_[trigger_selected_];
      FetchState();
    }
    return ret;
  }